

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

bool __thiscall
duckdb::CatalogSet::StartChain
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_lock<std::mutex> *read_lock)

{
  DuckCatalog *catalog;
  pointer pcVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  InCatalogEntry *this_00;
  pointer pIVar3;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_60;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_58;
  string local_50;
  
  oVar2 = CreateDefaultEntry(this,transaction,name,read_lock);
  if (oVar2.ptr == (CatalogEntry *)0x0) {
    catalog = this->catalog;
    this_00 = (InCatalogEntry *)operator_new(0xe0);
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    InCatalogEntry::InCatalogEntry(this_00,INVALID,&catalog->super_Catalog,&local_50);
    local_60._M_head_impl = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pIVar3 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_60);
    LOCK();
    (pIVar3->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pIVar3 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_60);
    (pIVar3->super_CatalogEntry).deleted = true;
    pIVar3 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_60);
    local_58._M_head_impl = local_60._M_head_impl;
    (pIVar3->super_CatalogEntry).set.ptr = this;
    local_60._M_head_impl = (InCatalogEntry *)0x0;
    CatalogEntryMap::AddEntry
              (&this->map,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_58);
    if (local_58._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_58._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    local_58._M_head_impl = (InCatalogEntry *)0x0;
    if (local_60._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_60._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
  }
  return oVar2.ptr == (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::StartChain(CatalogTransaction transaction, const string &name, unique_lock<mutex> &read_lock) {
	D_ASSERT(!map.GetEntry(name));

	// check if there is a default entry
	auto entry = CreateDefaultEntry(transaction, name, read_lock);
	if (entry) {
		return false;
	}

	// first create a dummy deleted entry
	// so other transactions will see that instead of the entry that is to be added.
	auto dummy_node = make_uniq<InCatalogEntry>(CatalogType::INVALID, catalog, name);
	dummy_node->timestamp = 0;
	dummy_node->deleted = true;
	dummy_node->set = this;

	map.AddEntry(std::move(dummy_node));
	return true;
}